

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

PropertyIndex __thiscall
Js::SimpleTypeHandler<3UL>::GetPropertyIndex
          (SimpleTypeHandler<3UL> *this,PropertyRecord *propertyRecord)

{
  BOOL BVar1;
  undefined8 in_RAX;
  ushort local_12 [4];
  PropertyIndex index;
  
  local_12[0] = (ushort)((ulong)in_RAX >> 0x30);
  BVar1 = GetDescriptor(this,propertyRecord->pid,local_12);
  if ((BVar1 == 0) || ((this->descriptors[local_12[0]].field_1.Attributes & 8) != 0)) {
    local_12[0] = 0xffff;
  }
  return local_12[0];
}

Assistant:

PropertyIndex SimpleTypeHandler<size>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            return (PropertyIndex)index;
        }
        return Constants::NoSlot;
    }